

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O2

void sen_BLOCK(treeNode *tn)

{
  bool bVar1;
  treeNode *ptVar2;
  allocator local_101;
  treeNode *assi_sent;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  bVar1 = std::operator==(&sym_abi_cxx11_,"identifier");
  if (bVar1) {
    ptVar2 = (treeNode *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_38,anon_var_dwarf_7f1b,&local_101);
    treeNode::treeNode(ptVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    assi_sent = ptVar2;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&assi_sent);
    assi_sen(assi_sent);
  }
  else {
    bVar1 = std::operator==(&sym_abi_cxx11_,"if");
    if (bVar1) {
      ptVar2 = (treeNode *)operator_new(0x38);
      std::__cxx11::string::string((string *)&local_58,anon_var_dwarf_7f27,&local_101);
      treeNode::treeNode(ptVar2,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      assi_sent = ptVar2;
      std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&assi_sent);
      condition_sen(assi_sent);
    }
    else {
      bVar1 = std::operator==(&sym_abi_cxx11_,"while");
      if (bVar1) {
        ptVar2 = (treeNode *)operator_new(0x38);
        std::__cxx11::string::string((string *)&local_78,anon_var_dwarf_7f33,&local_101);
        treeNode::treeNode(ptVar2,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        assi_sent = ptVar2;
        std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&assi_sent);
        do_while_sen(assi_sent);
      }
      else {
        bVar1 = std::operator==(&sym_abi_cxx11_,"call");
        if (bVar1) {
          ptVar2 = (treeNode *)operator_new(0x38);
          std::__cxx11::string::string((string *)&local_98,anon_var_dwarf_7f3f,&local_101);
          treeNode::treeNode(ptVar2,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          assi_sent = ptVar2;
          std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&assi_sent);
          proc_call_sen(assi_sent);
        }
        else {
          bVar1 = std::operator==(&sym_abi_cxx11_,"read");
          if (bVar1) {
            ptVar2 = (treeNode *)operator_new(0x38);
            std::__cxx11::string::string((string *)&local_b8,anon_var_dwarf_7f4b,&local_101);
            treeNode::treeNode(ptVar2,&local_b8);
            std::__cxx11::string::~string((string *)&local_b8);
            assi_sent = ptVar2;
            std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&assi_sent);
            read_sen(assi_sent);
          }
          else {
            bVar1 = std::operator==(&sym_abi_cxx11_,"write");
            if (bVar1) {
              ptVar2 = (treeNode *)operator_new(0x38);
              std::__cxx11::string::string((string *)&local_d8,anon_var_dwarf_7f57,&local_101);
              treeNode::treeNode(ptVar2,&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
              assi_sent = ptVar2;
              std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&tn->child,&assi_sent)
              ;
              write_sen(assi_sent);
            }
            else {
              bVar1 = std::operator==(&sym_abi_cxx11_,"begin");
              if (bVar1) {
                ptVar2 = (treeNode *)operator_new(0x38);
                std::__cxx11::string::string((string *)&local_f8,anon_var_dwarf_7f63,&local_101);
                treeNode::treeNode(ptVar2,&local_f8);
                std::__cxx11::string::~string((string *)&local_f8);
                assi_sent = ptVar2;
                std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back
                          (&tn->child,&assi_sent);
                complex_sen(assi_sent);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void sen_BLOCK(treeNode* tn)
{
    if (sym == "identifier") {
        auto *assi_sent = new treeNode("赋值语句");
        tn->child.push_back(assi_sent);
        assi_sen(assi_sent);
    }
    else if (sym == "if") {
        auto *condition_sent = new treeNode("条件语句");
        tn->child.push_back(condition_sent);
        condition_sen(condition_sent);
    }
    else if (sym == "while") {
        auto *do_while_sent = new treeNode("当型循环语句");
        tn->child.push_back(do_while_sent);
        do_while_sen(do_while_sent);
    }
    else if (sym == "call") {
        auto *proc_call_sent = new treeNode("过程调用语句");
        tn->child.push_back(proc_call_sent);
        proc_call_sen(proc_call_sent);
    }
    else if (sym == "read") {
        auto *read_sent = new treeNode("读语句");
        tn->child.push_back(read_sent);
        read_sen(read_sent);
    }
    else if (sym == "write") {
        auto *write_sent = new treeNode("写语句");
        tn->child.push_back(write_sent);
        write_sen(write_sent);
    }
    else if (sym == "begin") {
        auto *complex_sent = new treeNode("复合语句");
        tn->child.push_back(complex_sent);
        complex_sen(complex_sent);
    }
}